

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.h
# Opt level: O0

bool fmt::v9::detail::check_char_specs<char,fmt::v9::detail::error_handler>
               (basic_format_specs<char> *specs,error_handler *eh)

{
  error_handler *eh_local;
  basic_format_specs<char> *specs_local;
  
  if (((specs->type == none) || (specs->type == chr)) || (specs->type == debug)) {
    if (((((byte)*(undefined2 *)&specs->field_0x9 & 0xf) == 4) ||
        ((*(ushort *)&specs->field_0x9 >> 4 & 7) != 0)) ||
       ((*(ushort *)&specs->field_0x9 >> 7 & 1) != 0)) {
      error_handler::on_error(eh,"invalid format specifier for char");
    }
    specs_local._7_1_ = true;
  }
  else {
    check_int_type_spec<fmt::v9::detail::error_handler&>(specs->type,eh);
    specs_local._7_1_ = false;
  }
  return specs_local._7_1_;
}

Assistant:

FMT_CONSTEXPR auto check_char_specs(const basic_format_specs<Char>& specs,
                                    ErrorHandler&& eh = {}) -> bool {
  if (specs.type != presentation_type::none &&
      specs.type != presentation_type::chr &&
      specs.type != presentation_type::debug) {
    check_int_type_spec(specs.type, eh);
    return false;
  }
  if (specs.align == align::numeric || specs.sign != sign::none || specs.alt)
    eh.on_error("invalid format specifier for char");
  return true;
}